

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O3

void * slab_map(slab_arena *arena)

{
  size_t *psVar1;
  size_t sVar2;
  uint uVar3;
  quota *pqVar4;
  void *pvVar5;
  void *pvVar6;
  void *__e;
  ulong *puVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  do {
    pvVar6 = (arena->cache).next;
    puVar7 = (ulong *)((ulong)pvVar6 & 0xffffffffffff0000);
    if (puVar7 == (ulong *)0x0) {
      uVar3 = arena->slab_size;
      if ((ulong)uVar3 == 0) {
        __assert_fail("size_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0x89,"ssize_t quota_use(struct quota *, size_t)");
      }
      pqVar4 = arena->quota;
      while( true ) {
        uVar9 = pqVar4->value;
        uVar8 = (uint)uVar9 + (int)((ulong)uVar3 + 0x3ff >> 10);
        if (uVar8 <= (uint)uVar9) {
          __assert_fail("new_used_in_units > used_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0x90,"ssize_t quota_use(struct quota *, size_t)");
        }
        if ((uint)(uVar9 >> 0x20) < uVar8) break;
        LOCK();
        bVar10 = uVar9 == pqVar4->value;
        if (bVar10) {
          pqVar4->value = (ulong)uVar8 | uVar9 & 0xffffffff00000000;
        }
        UNLOCK();
        if (bVar10) {
          LOCK();
          psVar1 = &arena->used;
          sVar2 = *psVar1;
          *psVar1 = *psVar1 + (ulong)arena->slab_size;
          UNLOCK();
          uVar9 = (ulong)arena->slab_size;
          if (arena->prealloc < sVar2 + uVar9) {
            pvVar6 = mmap_checked(uVar9,uVar9,arena->flags);
            if (pvVar6 == (void *)0x0) {
              LOCK();
              arena->used = arena->used - (ulong)arena->slab_size;
              UNLOCK();
              uVar3 = arena->slab_size;
              if ((ulong)uVar3 == 0) {
                __assert_fail("size_in_units",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                              ,0xa5,"ssize_t quota_release(struct quota *, size_t)");
              }
              pqVar4 = arena->quota;
              pvVar6 = (void *)0x0;
              do {
                uVar9 = pqVar4->value;
                uVar8 = (uint)((ulong)uVar3 + 0x3ff >> 10);
                if ((uint)uVar9 < uVar8) {
                  __assert_fail("size_in_units <= used_in_units",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                                ,0xab,"ssize_t quota_release(struct quota *, size_t)");
                }
                LOCK();
                bVar10 = uVar9 == pqVar4->value;
                if (bVar10) {
                  pqVar4->value = (ulong)((uint)uVar9 - uVar8) | uVar9 & 0xffffffff00000000;
                }
                UNLOCK();
              } while (!bVar10);
            }
            else {
              madvise_checked(pvVar6,(ulong)arena->slab_size,arena->flags);
            }
          }
          else {
            pvVar6 = (void *)(sVar2 + (long)arena->arena);
          }
          return pvVar6;
        }
      }
      return (void *)0x0;
    }
    LOCK();
    pvVar5 = (arena->cache).next;
    if (pvVar6 == pvVar5) {
      (arena->cache).next = (void *)((ulong)pvVar6 & 0xffff | *puVar7 & 0xffffffffffff0000);
      pvVar5 = pvVar6;
    }
    UNLOCK();
  } while (pvVar6 != pvVar5);
  return puVar7;
}

Assistant:

void *
slab_map(struct slab_arena *arena)
{
	void *ptr;
	if ((ptr = lf_lifo_pop(&arena->cache))) {
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
		return ptr;
	}

	if (quota_use(arena->quota, arena->slab_size) < 0)
		return NULL;

	/** Need to allocate a new slab. */
	size_t used = pm_atomic_fetch_add(&arena->used, arena->slab_size);
	used += arena->slab_size;
	if (used <= arena->prealloc) {
		ptr = arena->arena + used - arena->slab_size;
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
		return ptr;
	}

	ptr = mmap_checked(arena->slab_size, arena->slab_size,
			   arena->flags);
	if (!ptr) {
		__sync_sub_and_fetch(&arena->used, arena->slab_size);
		quota_release(arena->quota, arena->slab_size);
	}

	madvise_checked(ptr, arena->slab_size, arena->flags);

	VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
	return ptr;
}